

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.h
# Opt level: O0

Float * __thiscall pbrt::XYZ::operator[](XYZ *this,int c)

{
  int c_local;
  XYZ *this_local;
  XYZ *local_8;
  
  local_8 = this;
  if (c != 0) {
    if (c == 1) {
      local_8 = (XYZ *)&this->Y;
    }
    else {
      local_8 = (XYZ *)&this->Z;
    }
  }
  return &local_8->X;
}

Assistant:

PBRT_CPU_GPU
    Float &operator[](int c) {
        DCHECK(c >= 0 && c < 3);
        if (c == 0)
            return X;
        else if (c == 1)
            return Y;
        return Z;
    }